

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketAcceptor.cpp
# Opt level: O1

void * FIX::ThreadedSocketAcceptor::socketAcceptorThread(void *p)

{
  socket_handle s;
  int iVar1;
  ThreadedSocketAcceptor *this;
  bool bVar2;
  socket_handle s_00;
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  *__x;
  ThreadedSocketConnection *this_00;
  undefined8 *var;
  char *__s;
  size_t sVar3;
  NullLog *pNVar4;
  int port;
  int rcvBufSize;
  int sendBufSize;
  int noDelay;
  thread_id thread;
  Sessions sessions;
  stringstream stream;
  int local_264;
  pthread_mutex_t *local_260;
  int local_254;
  int local_250;
  int local_24c;
  NullLog *local_248;
  PortToSessions *local_240;
  long *local_238 [2];
  long local_228 [2];
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  local_218;
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  local_1e8;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  this = *p;
  s = *(socket_handle *)((long)p + 8);
  local_264 = *(int *)((long)p + 0xc);
  operator_delete(p,0x10);
  local_24c = 0;
  local_250 = 0;
  local_254 = 0;
  socket_getsockopt(s,1,&local_24c);
  socket_getsockopt(s,7,&local_250);
  socket_getsockopt(s,8,&local_254);
  if (((this->super_Acceptor).m_stop._M_base._M_i & 1U) == 0) {
    local_240 = &this->m_portToSessions;
    local_248 = &(this->super_Acceptor).m_nullLog;
    local_260 = (pthread_mutex_t *)&this->m_mutex;
    do {
      s_00 = socket_accept(s);
      if (s_00 == -1) break;
      if (local_24c != 0) {
        socket_setsockopt(s_00,1);
      }
      if (local_250 != 0) {
        socket_setsockopt(s_00,7,local_250);
      }
      if (local_254 != 0) {
        socket_setsockopt(s_00,8,local_254);
      }
      __x = &std::
             map<int,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>_>_>_>
             ::operator[](local_240,&local_264)->_M_t;
      std::
      _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
      ::_Rb_tree(&local_218,__x);
      this_00 = (ThreadedSocketConnection *)operator_new(0x20c8);
      std::
      _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
      ::_Rb_tree(&local_1e8,&local_218);
      pNVar4 = (NullLog *)(this->super_Acceptor).m_pLog;
      if (pNVar4 == (NullLog *)0x0) {
        pNVar4 = local_248;
      }
      ThreadedSocketConnection::ThreadedSocketConnection
                (this_00,s_00,(Sessions *)&local_1e8,&pNVar4->super_Log);
      std::
      _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
      ::~_Rb_tree(&local_1e8);
      var = (undefined8 *)operator_new(0x10);
      *var = this;
      var[1] = this_00;
      Mutex::lock((Mutex *)&local_260->__data);
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Accepted connection from ",0x19);
      __s = socket_peername(s_00);
      if (__s == (char *)0x0) {
        std::ios::clear((int)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
      }
      else {
        sVar3 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," on port ",9);
      std::ostream::operator<<((ostream *)local_1a8,local_264);
      pNVar4 = (NullLog *)(this->super_Acceptor).m_pLog;
      std::__cxx11::stringbuf::str();
      if (pNVar4 == (NullLog *)0x0) {
        pNVar4 = local_248;
      }
      (*(pNVar4->super_Log)._vptr_Log[6])(pNVar4,local_238);
      if (local_238[0] != local_228) {
        operator_delete(local_238[0],local_228[0] + 1);
      }
      bVar2 = thread_spawn(socketConnectionThread,var,(thread_id *)local_238);
      if (bVar2) {
        addThread(this,s_00,(thread_id)local_238[0]);
      }
      else {
        operator_delete(var,0x10);
        (*(this_00->super_Responder)._vptr_Responder[1])(this_00);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      iVar1 = (this->m_mutex).m_count;
      (this->m_mutex).m_count = iVar1 + -1;
      if (iVar1 < 2) {
        (this->m_mutex).m_threadID = 0;
        pthread_mutex_unlock(local_260);
      }
      std::
      _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
      ::~_Rb_tree(&local_218);
    } while (((this->super_Acceptor).m_stop._M_base._M_i & 1U) == 0);
  }
  if (((this->super_Acceptor).m_stop._M_base._M_i & 1U) == 0) {
    removeThread(this,s);
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC ThreadedSocketAcceptor::socketAcceptorThread(void *p) {
  AcceptorThreadInfo *info = reinterpret_cast<AcceptorThreadInfo *>(p);

  ThreadedSocketAcceptor *pAcceptor = info->m_pAcceptor;
  socket_handle s = info->m_socket;
  int port = info->m_port;
  delete info;

  int noDelay = 0;
  int sendBufSize = 0;
  int rcvBufSize = 0;
  socket_getsockopt(s, TCP_NODELAY, noDelay);
  socket_getsockopt(s, SO_SNDBUF, sendBufSize);
  socket_getsockopt(s, SO_RCVBUF, rcvBufSize);

  socket_handle socket = 0;
  while ((!pAcceptor->isStopped() && (socket = socket_accept(s)) != INVALID_SOCKET_HANDLE)) {
    if (noDelay) {
      socket_setsockopt(socket, TCP_NODELAY);
    }
    if (sendBufSize) {
      socket_setsockopt(socket, SO_SNDBUF, sendBufSize);
    }
    if (rcvBufSize) {
      socket_setsockopt(socket, SO_RCVBUF, rcvBufSize);
    }

    Sessions sessions = pAcceptor->m_portToSessions[port];

    ThreadedSocketConnection *pConnection = new ThreadedSocketConnection(socket, sessions, pAcceptor->getLog());

    ConnectionThreadInfo *info = new ConnectionThreadInfo(pAcceptor, pConnection);

    {
      Locker l(pAcceptor->m_mutex);

      std::stringstream stream;
      stream << "Accepted connection from " << socket_peername(socket) << " on port " << port;

      if (pAcceptor->getLog()) {
        pAcceptor->getLog()->onEvent(stream.str());
      }

      thread_id thread;
      if (!thread_spawn(&socketConnectionThread, info, thread)) {
        delete info;
        delete pConnection;
      } else {
        pAcceptor->addThread(socket, thread);
      }
    }
  }

  if (!pAcceptor->isStopped()) {
    pAcceptor->removeThread(s);
  }

  return 0;
}